

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O3

bool __thiscall
sptk::GaussianMixtureModeling::Run
          (GaussianMixtureModeling *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *input_vectors,vector<double,_std::allocator<double>_> *weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          ,double *total_log_likelihood)

{
  SymmetricMatrix *pSVar1;
  double dVar2;
  double dVar3;
  InitializationType IVar4;
  void *__s;
  void *pvVar5;
  pointer pdVar6;
  pointer pvVar7;
  pointer pvVar8;
  pointer pdVar9;
  long lVar10;
  GaussianMixtureModeling *pGVar11;
  bool bVar12;
  double *pdVar13;
  ostream *poVar14;
  size_type sVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  size_type __n;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  double dVar24;
  long lVar25;
  long local_1f0;
  Row local_1e0;
  double local_1c8;
  double local_1c0;
  ulong local_1b8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_1b0;
  GaussianMixtureModeling *local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  vector<double,_std::allocator<double>_> buffer0;
  double local_160;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  buffer1;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> buffer2;
  double denominator;
  pointer local_118;
  int local_110;
  double *local_108;
  long local_100;
  double local_f8;
  long local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  vector<double,_std::allocator<double>_> numerators;
  Buffer buffer;
  
  if (this->is_valid_ == true) {
    if (total_log_likelihood == (double *)0x0) {
      return false;
    }
    if (covariance_matrices ==
        (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)0x0) {
      return false;
    }
    if (mean_vectors ==
        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *)0x0) {
      return false;
    }
    if (weights == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    if ((input_vectors->
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (input_vectors->
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    sVar15 = (long)this->num_order_ + 1;
    IVar4 = this->initialization_type_;
    iVar17 = (int)sVar15;
    local_1b0 = input_vectors;
    if (IVar4 == kUbm) {
      std::vector<double,_std::allocator<double>_>::operator=(weights,&this->ubm_weights_);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(mean_vectors,&this->ubm_mean_vectors_);
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator=
                (covariance_matrices,&this->ubm_covariance_matrices_);
    }
    else {
      if (IVar4 == kKMeans) {
        bVar12 = Initialize(this,input_vectors,weights,mean_vectors,covariance_matrices);
      }
      else {
        if (IVar4 != kNone) goto LAB_00108a4e;
        bVar12 = anon_unknown.dwarf_2318e::CheckGmm
                           (this->num_mixture_,iVar17,
                            (vector<double,_std::allocator<double>_> *)
                            (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start,
                            (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(weights->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_finish,
                            (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *
                            )(mean_vectors->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
      }
      if (bVar12 == false) goto LAB_00108a4e;
    }
    local_108 = total_log_likelihood;
    std::vector<double,_std::allocator<double>_>::vector
              (&buffer0,(long)this->num_mixture_,(allocator_type *)&buffer);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&buffer1,(long)this->num_mixture_,(allocator_type *)&buffer);
    __n = (size_type)this->num_mixture_;
    if (0 < (long)__n) {
      lVar22 = 0;
      lVar25 = 0;
      do {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&((buffer1.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar22),sVar15);
        lVar25 = lVar25 + 1;
        __n = (size_type)this->num_mixture_;
        lVar22 = lVar22 + 0x18;
      } while (lVar25 < (long)__n);
    }
    std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
              (&buffer2,__n,(allocator_type *)&buffer);
    sVar15 = (size_type)this->num_mixture_;
    if (0 < (long)sVar15) {
      lVar22 = 0;
      lVar25 = 0;
      do {
        SymmetricMatrix::Resize
                  ((SymmetricMatrix *)
                   ((long)&(buffer2.
                            super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                   lVar22),iVar17);
        lVar25 = lVar25 + 1;
        sVar15 = (size_type)this->num_mixture_;
        lVar22 = lVar22 + 0x40;
      } while (lVar25 < (long)sVar15);
    }
    buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_0011faf0;
    buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buffer.precisions_.
    super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buffer.precisions_.
    super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    buffer.precisions_.
    super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    buffer.precisions_.
    super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    buffer._73_8_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              (&numerators,sVar15,(allocator_type *)&local_1e0);
    bVar12 = true;
    if (0 < this->num_iteration_) {
      pSVar1 = &this->mask_;
      local_1b8 = 1;
      local_160 = -1.79769313486232e+308;
      local_1a8 = this;
      do {
        if (buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start !=
            buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memset(buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,0,
                 ((long)buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish +
                  (-8 - (long)buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8);
        }
        uVar19 = (ulong)(uint)this->num_mixture_;
        if (0 < this->num_mixture_) {
          lVar22 = 8;
          lVar23 = 0;
          lVar25 = 0;
          do {
            __s = *(void **)((long)buffer1.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar22 + -8);
            pvVar5 = *(void **)((long)&((buffer1.
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data._M_start + lVar22);
            if (__s != pvVar5) {
              memset(__s,0,((long)pvVar5 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
            }
            SymmetricMatrix::Fill
                      ((SymmetricMatrix *)
                       ((long)&(buffer2.
                                super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                       lVar23),0.0);
            lVar25 = lVar25 + 1;
            uVar19 = (ulong)this->num_mixture_;
            lVar22 = lVar22 + 0x18;
            lVar23 = lVar23 + 0x40;
          } while (lVar25 < (long)uVar19);
        }
        uVar18 = (uint)uVar19;
        buffer._73_8_ = buffer._73_8_ & 0xffffffffffffff;
        local_1a0 = (double)(((long)(local_1b0->
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_1b0->
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555);
        if ((int)SUB84(local_1a0,0) < 1) {
          local_1c8 = 0.0;
        }
        else {
          local_198 = (double)(ulong)(SUB84(local_1a0,0) & 0x7fffffff);
          local_1c8 = 0.0;
          dVar24 = 0.0;
          do {
            bVar12 = CalculateLogProbability
                               (this->num_order_,(int)uVar19,this->is_diagonal_,false,
                                (local_1b0->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + (long)dVar24,weights,
                                mean_vectors,covariance_matrices,&numerators,&denominator,&buffer);
            if (!bVar12) {
              bVar12 = false;
              goto LAB_0010971f;
            }
            local_1c8 = local_1c8 + denominator;
            uVar19 = (ulong)(uint)this->num_mixture_;
            if (0 < this->num_mixture_) {
              lVar22 = *(long *)&(local_1b0->
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[(long)dVar24].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data;
              lVar25 = 0;
              do {
                local_1c0 = exp(numerators.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar25] - denominator);
                buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar25] =
                     buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar25] + local_1c0;
                uVar18 = this->num_order_;
                if (-1 < (int)uVar18) {
                  pdVar6 = buffer1.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar25].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  lVar23 = 0;
                  do {
                    pdVar6[lVar23] = *(double *)(lVar22 + lVar23 * 8) * local_1c0 + pdVar6[lVar23];
                    lVar23 = lVar23 + 1;
                  } while ((ulong)uVar18 + 1 != lVar23);
                  if (-1 < (int)uVar18) {
                    uVar19 = 0;
                    do {
                      uVar21 = uVar19 & 0xffffffff;
                      if (this->is_diagonal_ == false) {
                        uVar21 = 0;
                      }
                      do {
                        local_1e0._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                        local_1e0.matrix_ = pSVar1;
                        local_1e0.row_ = (int)uVar19;
                        pdVar13 = SymmetricMatrix::Row::operator[](&local_1e0,(int)uVar21);
                        if ((*pdVar13 != 0.0) || (NAN(*pdVar13))) {
                          dVar2 = *(double *)(lVar22 + uVar19 * 8);
                          local_1e0.matrix_ =
                               buffer2.
                               super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar25;
                          local_190 = *(double *)(lVar22 + uVar21 * 8);
                          local_1e0._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                          local_1e0.row_ = (int)uVar19;
                          pdVar13 = SymmetricMatrix::Row::operator[](&local_1e0,(int)uVar21);
                          *pdVar13 = dVar2 * local_1c0 * local_190 + *pdVar13;
                        }
                        uVar21 = uVar21 + 1;
                      } while (uVar19 + 1 != uVar21);
                      bVar12 = (long)uVar19 < (long)local_1a8->num_order_;
                      uVar19 = uVar19 + 1;
                      this = local_1a8;
                    } while (bVar12);
                  }
                }
                lVar25 = lVar25 + 1;
                uVar19 = (ulong)this->num_mixture_;
              } while (lVar25 < (long)uVar19);
            }
            uVar18 = (uint)uVar19;
            dVar24 = (double)((long)dVar24 + 1);
          } while (dVar24 != local_198);
        }
        dVar24 = this->smoothing_parameter_;
        dVar2 = (double)local_1a0._0_4_;
        if ((dVar24 != 0.0) || (NAN(dVar24))) {
          if (0 < (int)uVar18) {
            pdVar6 = (this->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar9 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar19 = 0;
            do {
              pdVar9[uVar19] =
                   (buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar19] + pdVar6[uVar19]) *
                   (1.0 / (dVar24 + dVar2));
              uVar19 = uVar19 + 1;
            } while (uVar18 != uVar19);
          }
        }
        else if (0 < (int)uVar18) {
          pdVar6 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar19 = 0;
          do {
            pdVar6[uVar19] =
                 buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar19] * (1.0 / dVar2);
            uVar19 = uVar19 + 1;
          } while (uVar18 != uVar19);
        }
        FloorWeight(this,weights);
        uVar18 = this->num_mixture_;
        uVar19 = (ulong)uVar18;
        if ((this->smoothing_parameter_ != 0.0) || (NAN(this->smoothing_parameter_))) {
          if (0 < (int)uVar18) {
            pvVar7 = (mean_vectors->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pdVar6 = (this->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar17 = this->num_order_;
            pvVar8 = (this->ubm_mean_vectors_).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar21 = 0;
            do {
              if (-1 < iVar17) {
                dVar24 = buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar21];
                dVar3 = pdVar6[uVar21];
                lVar22 = *(long *)&pvVar7[uVar21].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                pdVar9 = buffer1.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar25 = *(long *)&pvVar8[uVar21].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                uVar16 = 0;
                do {
                  *(double *)(lVar22 + uVar16 * 8) =
                       (pdVar6[uVar21] * *(double *)(lVar25 + uVar16 * 8) + pdVar9[uVar16]) *
                       (1.0 / (dVar24 + dVar3));
                  uVar16 = uVar16 + 1;
                } while (iVar17 + 1 != uVar16);
              }
              uVar21 = uVar21 + 1;
              this = local_1a8;
            } while (uVar21 != uVar19);
            goto LAB_001090ca;
          }
          bVar12 = false;
        }
        else if ((int)uVar18 < 1) {
          bVar12 = true;
        }
        else {
          pvVar7 = (mean_vectors->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          iVar17 = this->num_order_;
          uVar21 = 0;
          do {
            if (-1 < iVar17) {
              lVar22 = *(long *)&pvVar7[uVar21].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data;
              dVar24 = buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar21];
              pdVar6 = buffer1.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar21].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar16 = 0;
              do {
                *(double *)(lVar22 + uVar16 * 8) = pdVar6[uVar16] * (1.0 / dVar24);
                uVar16 = uVar16 + 1;
              } while (iVar17 + 1 != uVar16);
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar19);
LAB_001090ca:
          bVar12 = this->smoothing_parameter_ == 0.0;
        }
        if (bVar12) {
          if (0 < (int)uVar18) {
            uVar21 = (ulong)(uint)this->num_order_;
            local_1f0 = 0;
            do {
              if (-1 < (int)uVar21) {
                local_198 = *(double *)
                             &(mean_vectors->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[local_1f0].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
                local_1a0 = 1.0 / buffer0.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[local_1f0];
                uVar19 = 0;
                do {
                  iVar17 = (int)uVar19;
                  uVar21 = uVar19 & 0xffffffff;
                  if (this->is_diagonal_ == false) {
                    uVar21 = 0;
                  }
                  do {
                    local_1e0._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                    iVar20 = (int)uVar21;
                    local_1e0.matrix_ = pSVar1;
                    local_1e0.row_ = iVar17;
                    pdVar13 = SymmetricMatrix::Row::operator[](&local_1e0,iVar20);
                    if ((*pdVar13 != 0.0) || (NAN(*pdVar13))) {
                      local_1e0.matrix_ =
                           buffer2.
                           super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                           ._M_impl.super__Vector_impl_data._M_start + local_1f0;
                      local_1e0._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                      local_1e0.row_ = iVar17;
                      pdVar13 = SymmetricMatrix::Row::operator[](&local_1e0,iVar20);
                      dVar24 = *pdVar13;
                      local_190 = *(double *)((long)local_198 + uVar19 * 8);
                      local_118 = (covariance_matrices->
                                  super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                  )._M_impl.super__Vector_impl_data._M_start + local_1f0;
                      local_1c0 = *(double *)((long)local_198 + uVar21 * 8);
                      denominator = (double)&PTR__Row_0011fac0;
                      local_110 = iVar17;
                      pdVar13 = SymmetricMatrix::Row::operator[]((Row *)&denominator,iVar20);
                      *pdVar13 = dVar24 * local_1a0 - local_1c0 * local_190;
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar19 + 1 != uVar21);
                  uVar21 = (ulong)local_1a8->num_order_;
                  bVar12 = (long)uVar19 < (long)uVar21;
                  this = local_1a8;
                  uVar19 = uVar19 + 1;
                } while (bVar12);
                uVar19 = (ulong)(uint)local_1a8->num_mixture_;
              }
              local_1f0 = local_1f0 + 1;
            } while (local_1f0 < (int)uVar19);
          }
        }
        else if (0 < (int)uVar18) {
          uVar21 = (ulong)(uint)this->num_order_;
          lVar22 = 0;
          do {
            lVar25 = lVar22;
            if (-1 < (int)uVar21) {
              lVar23 = *(long *)&(mean_vectors->
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[lVar22].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data;
              local_f8 = 1.0 / (buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar22] +
                               (this->xi_).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar22]);
              uVar19 = 0;
              local_100 = lVar22;
              local_f0 = lVar23;
              do {
                uVar21 = uVar19 & 0xffffffff;
                if (this->is_diagonal_ == false) {
                  uVar21 = 0;
                }
                do {
                  local_1e0._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                  iVar17 = (int)uVar19;
                  iVar20 = (int)uVar21;
                  local_1e0.matrix_ = pSVar1;
                  local_1e0.row_ = iVar17;
                  pdVar13 = SymmetricMatrix::Row::operator[](&local_1e0,iVar20);
                  if ((*pdVar13 != 0.0) || (NAN(*pdVar13))) {
                    pdVar6 = buffer1.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar22].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    local_190 = pdVar6[uVar19];
                    dVar24 = buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar25];
                    local_1c0 = pdVar6[uVar21];
                    local_1e0.matrix_ =
                         buffer2.
                         super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar25;
                    local_1e0._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                    local_1e0.row_ = iVar17;
                    pdVar13 = SymmetricMatrix::Row::operator[](&local_1e0,iVar20);
                    pGVar11 = local_1a8;
                    local_1a0 = *pdVar13;
                    local_a8 = buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar25];
                    local_b8 = *(double *)(lVar23 + uVar21 * 8);
                    local_b0 = *(double *)(lVar23 + uVar19 * 8);
                    local_198 = (local_1a8->xi_).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar25];
                    local_1e0.matrix_ =
                         (local_1a8->ubm_covariance_matrices_).
                         super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar25;
                    local_1e0._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                    local_1e0.row_ = iVar17;
                    pdVar13 = SymmetricMatrix::Row::operator[](&local_1e0,iVar20);
                    lVar23 = local_f0;
                    local_d8 = *pdVar13;
                    local_c8 = (pGVar11->xi_).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar25];
                    lVar10 = *(long *)&(pGVar11->ubm_mean_vectors_).
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar22].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data;
                    local_d0 = *(double *)(lVar10 + uVar19 * 8);
                    local_e0 = *(double *)(local_f0 + uVar19 * 8);
                    local_c0 = *(double *)(lVar10 + uVar21 * 8);
                    local_1e0.matrix_ =
                         (covariance_matrices->
                         super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar25;
                    local_e8 = *(double *)(local_f0 + uVar21 * 8);
                    local_1e0._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                    local_1e0.row_ = iVar17;
                    pdVar13 = SymmetricMatrix::Row::operator[](&local_1e0,iVar20);
                    *pdVar13 = ((local_c0 - local_e8) * local_c8 * (local_d0 - local_e0) +
                               local_198 * local_d8 +
                               (local_1a0 -
                               local_a8 *
                               (((local_190 / dVar24) * local_b8 + (local_1c0 / dVar24) * local_b0)
                               - local_b0 * local_b8))) * local_f8;
                    lVar25 = local_100;
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar19 + 1 != uVar21);
                uVar21 = (ulong)local_1a8->num_order_;
                bVar12 = (long)uVar19 < (long)uVar21;
                uVar19 = uVar19 + 1;
                this = local_1a8;
              } while (bVar12);
              uVar19 = (ulong)(uint)local_1a8->num_mixture_;
            }
            lVar22 = lVar25 + 1;
          } while (lVar22 < (int)uVar19);
        }
        FloorVariance(this,covariance_matrices);
        *local_108 = local_1c8;
        local_1c8 = local_1c8 / dVar2;
        local_160 = local_1c8 - local_160;
        if ((int)((long)((ulong)(uint)((int)local_1b8 >> 0x1f) << 0x20 | local_1b8 & 0xffffffff) %
                 (long)this->log_interval_) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"iter ",5);
          *(undefined8 *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = 3;
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," : ",3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"average = ",10);
          std::ostream::_M_insert<double>(local_1c8);
          poVar14 = (ostream *)&std::cerr;
          if ((int)local_1b8 != 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,", change = ",0xb);
            poVar14 = std::ostream::_M_insert<double>(local_160);
          }
          std::endl<char,std::char_traits<char>>(poVar14);
        }
        if (local_160 < this->convergence_threshold_) break;
        iVar17 = (int)local_1b8;
        local_1b8 = (ulong)(iVar17 + 1);
        local_160 = local_1c8;
      } while (iVar17 < this->num_iteration_);
      bVar12 = true;
    }
LAB_0010971f:
    if (numerators.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(numerators.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Buffer::~Buffer(&buffer);
    std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector(&buffer2);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&buffer1);
    if (buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
LAB_00108a4e:
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool GaussianMixtureModeling::Run(
    const std::vector<std::vector<double> >& input_vectors,
    std::vector<double>* weights,
    std::vector<std::vector<double> >* mean_vectors,
    std::vector<SymmetricMatrix>* covariance_matrices,
    double* total_log_likelihood) const {
  // Check inputs.
  if (!is_valid_ || input_vectors.empty() || NULL == weights ||
      NULL == mean_vectors || NULL == covariance_matrices ||
      NULL == total_log_likelihood) {
    return false;
  }

  // Initialize GMM parameters.
  const int length(num_order_ + 1);
  switch (initialization_type_) {
    case kNone: {
      if (!CheckGmm(num_mixture_, length, *weights, *mean_vectors,
                    *covariance_matrices)) {
        return false;
      }
      break;
    }
    case kKMeans: {
      if (!Initialize(input_vectors, weights, mean_vectors,
                      covariance_matrices)) {
        return false;
      }
      break;
    }
    case kUbm: {
      *weights = ubm_weights_;
      *mean_vectors = ubm_mean_vectors_;
      *covariance_matrices = ubm_covariance_matrices_;
      break;
    }
    default: {
      return false;
    }
  }

  // Prepare memories.
  std::vector<double> buffer0(num_mixture_);
  std::vector<std::vector<double> > buffer1(num_mixture_);
  for (int k(0); k < num_mixture_; ++k) {
    buffer1[k].resize(length);
  }
  std::vector<SymmetricMatrix> buffer2(num_mixture_);
  for (int k(0); k < num_mixture_; ++k) {
    buffer2[k].Resize(length);
  }
  GaussianMixtureModeling::Buffer buffer;
  std::vector<double> numerators(num_mixture_);

  double prev_log_likelihood(sptk::kMin);

  for (int n(1); n <= num_iteration_; ++n) {
    // Clear buffers.
    std::fill(buffer0.begin(), buffer0.end(), 0.0);
    for (int k(0); k < num_mixture_; ++k) {
      std::fill(buffer1[k].begin(), buffer1[k].end(), 0.0);
      buffer2[k].Fill(0.0);
    }
    buffer.precomputed_ = false;

    // Perform E-step.
    double log_likelihood(0.0);
    const int num_data(static_cast<int>(input_vectors.size()));
    for (int t(0); t < num_data; ++t) {
      // Compute log-likelihood of data.
      double denominator;
      if (!CalculateLogProbability(num_order_, num_mixture_, is_diagonal_,
                                   false, input_vectors[t], *weights,
                                   *mean_vectors, *covariance_matrices,
                                   &numerators, &denominator, &buffer)) {
        return false;
      }
      log_likelihood += denominator;

      const double* x(&(input_vectors[t][0]));
      for (int k(0); k < num_mixture_; ++k) {
        const double posterior(std::exp(numerators[k] - denominator));

        // Accumulate zeroth-order statistics.
        buffer0[k] += posterior;

        // Accumulate first-order statistics.
        for (int l(0); l <= num_order_; ++l) {
          buffer1[k][l] += posterior * x[l];
        }

        // Accumulate second-order statistics.
        for (int l(0); l <= num_order_; ++l) {
          for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
            if (0.0 != mask_[l][m]) {
              buffer2[k][l][m] += posterior * x[l] * x[m];
            }
          }
        }
      }
    }

    // Update mixture weights.
    if (0.0 == smoothing_parameter_) {
      const double z(1.0 / num_data);
      for (int k(0); k < num_mixture_; ++k) {
        (*weights)[k] = buffer0[k] * z;
      }
    } else {
      const double z(1.0 / (num_data + smoothing_parameter_));
      for (int k(0); k < num_mixture_; ++k) {
        (*weights)[k] = (buffer0[k] + xi_[k]) * z;
      }
    }
    FloorWeight(weights);

    // Update mean vectors.
    if (0.0 == smoothing_parameter_) {
      for (int k(0); k < num_mixture_; ++k) {
        double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / buffer0[k]);
        for (int l(0); l <= num_order_; ++l) {
          mu[l] = buffer1[k][l] * z;
        }
      }
    } else {
      for (int k(0); k < num_mixture_; ++k) {
        double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / (buffer0[k] + xi_[k]));
        for (int l(0); l <= num_order_; ++l) {
          mu[l] = (buffer1[k][l] + xi_[k] * ubm_mean_vectors_[k][l]) * z;
        }
      }
    }

    // Update covariance matrices.
    if (0.0 == smoothing_parameter_) {
      for (int k(0); k < num_mixture_; ++k) {
        const double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / buffer0[k]);
        for (int l(0); l <= num_order_; ++l) {
          for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
            if (0.0 != mask_[l][m]) {
              (*covariance_matrices)[k][l][m] =
                  buffer2[k][l][m] * z - (mu[l] * mu[m]);
            }
          }
        }
      }
    } else {
      for (int k(0); k < num_mixture_; ++k) {
        const double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / (buffer0[k] + xi_[k]));
        for (int l(0); l <= num_order_; ++l) {
          for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
            if (0.0 != mask_[l][m]) {
              const double mu_l(buffer1[k][l] / buffer0[k]);
              const double mu_m(buffer1[k][m] / buffer0[k]);
              const double a(buffer2[k][l][m] -
                             buffer0[k] *
                                 (mu_l * mu[m] + mu[l] * mu_m - mu[l] * mu[m]));
              const double b(xi_[k] * ubm_covariance_matrices_[k][l][m]);
              const double c(xi_[k] * (ubm_mean_vectors_[k][l] - mu[l]) *
                             (ubm_mean_vectors_[k][m] - mu[m]));
              (*covariance_matrices)[k][l][m] = (a + b + c) * z;
            }
          }
        }
      }
    }
    FloorVariance(covariance_matrices);

    // Check convergence.
    *total_log_likelihood = log_likelihood;
    log_likelihood /= num_data;
    const double change(log_likelihood - prev_log_likelihood);
    if (0 == n % log_interval_) {
      std::cerr << "iter " << std::setw(3) << n << " : ";
      std::cerr << "average = " << log_likelihood;
      if (1 == n) {
        std::cerr << std::endl;
      } else {
        std::cerr << ", change = " << change << std::endl;
      }
    }
    if (change < convergence_threshold_) {
      break;
    }
    prev_log_likelihood = log_likelihood;
  }

  return true;
}